

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O2

void __thiscall PolicyPureVector::SetIndex(PolicyPureVector *this,LIndex i)

{
  uint uVar1;
  int iVar2;
  Index IVar3;
  Interface_ProblemToPolicyDiscretePure *pIVar4;
  unsigned_long_long uVar5;
  reference pvVar6;
  ulong __n;
  undefined1 auVar7 [64];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> indexVec;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrElems;
  _Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_48;
  undefined1 extraout_var [56];
  
  pIVar4 = PolicyDiscretePure::GetInterfacePTPDiscretePure(&this->super_PolicyDiscretePure);
  uVar1 = (*(pIVar4->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[5])
                    (pIVar4,(ulong)*(uint *)&(this->super_PolicyDiscretePure).super_PolicyDiscrete.
                                             field_0x34,
                     (ulong)(this->super_PolicyDiscretePure).super_PolicyDiscrete._m_indexDomCat,
                     (this->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy._m_depth);
  pIVar4 = PolicyDiscretePure::GetInterfacePTPDiscretePure(&this->super_PolicyDiscretePure);
  iVar2 = (*(pIVar4->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[4])
                    (pIVar4,(ulong)*(uint *)&(this->super_PolicyDiscretePure).super_PolicyDiscrete.
                                             field_0x34);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&nrElems,2,(allocator_type *)&indexVec);
  auVar7._0_8_ = pow((double)iVar2,(double)(int)uVar1);
  auVar7._8_56_ = extraout_var;
  uVar5 = vcvttsd2usi_avx512f(auVar7._0_16_);
  *nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
   super__Vector_impl_data._M_start = uVar5;
  nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (long)iVar2;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&indexVec,2,(allocator_type *)&local_48);
  __n = (ulong)uVar1;
  while (0 < (int)__n) {
    *nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
     super__Vector_impl_data._M_start =
         *nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
          _M_impl.super__Vector_impl_data._M_start / (ulong)(long)(int)uVar1;
    IndexTools::JointToIndividualIndices
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_48,i,
               &nrElems);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::_M_move_assign
              (&indexVec,&local_48);
    std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
              (&local_48);
    IVar3 = Globals::CastLIndexToIndex
                      (indexVec.
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[1]);
    __n = __n - 1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->_m_domainToActionIndices,__n);
    *pvVar6 = IVar3;
    i = *indexVec.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&indexVec.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  return;
}

Assistant:

void PolicyPureVector::SetIndex(LIndex i)
{
    int nrO=GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(_m_agentI, 
                                  GetPolicyDomainCategory(),
                                  GetDepth()),
        nrA=GetInterfacePTPDiscretePure()->GetNrActions(_m_agentI);
    
    vector<LIndex> nrElems(2);
    nrElems[0]=static_cast<LIndex>(pow(static_cast<double>(nrA),nrO));
    nrElems[1]=nrA;
    vector<LIndex> indexVec(2);

    for(int o=nrO-1;o>=0;--o)
    {
        nrElems[0]/=nrO;
        indexVec=IndexTools::JointToIndividualIndices(i,nrElems);
        SetAction(o,CastLIndexToIndex(indexVec[1]));
        i=indexVec[0];
    }
}